

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_shader_module
          (Impl *this,VkShaderModuleCreateInfo *create_info,ScratchAllocator *alloc,
          bool ignore_pnext,VkShaderModuleCreateInfo **out_create_info)

{
  void **out_pnext;
  bool bVar1;
  VkShaderModuleCreateInfo *pVVar2;
  uint *puVar3;
  undefined7 in_register_00000009;
  
  pVVar2 = copy<VkShaderModuleCreateInfo>(this,create_info,1,alloc);
  out_pnext = &pVVar2->pNext;
  if ((int)CONCAT71(in_register_00000009,ignore_pnext) == 0) {
    bVar1 = copy_pnext_chain(this,*out_pnext,alloc,out_pnext,(DynamicStateInfo *)0x0,0);
    if (!bVar1) {
      return false;
    }
  }
  else {
    *out_pnext = (void *)0x0;
  }
  puVar3 = copy<unsigned_int>(this,pVVar2->pCode,pVVar2->codeSize >> 2,alloc);
  pVVar2->pCode = puVar3;
  *out_create_info = pVVar2;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_shader_module(const VkShaderModuleCreateInfo *create_info, ScratchAllocator &alloc,
                                             bool ignore_pnext, VkShaderModuleCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);

	if (ignore_pnext)
		info->pNext = nullptr;
	else if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	info->pCode = copy(info->pCode, info->codeSize / sizeof(uint32_t), alloc);

	*out_create_info = info;
	return true;
}